

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlr.cc
# Opt level: O0

int64_t __thiscall dlr::DLR::GetShpaeSize(DLR *this,string *name)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  reference this_00;
  reference plVar4;
  int64_t sz;
  iterator __end1;
  iterator __begin1;
  value_type *__range1;
  size_t shape_size;
  int in_idx;
  string *name_local;
  DLR *this_local;
  
  peVar3 = std::
           __shared_ptr_access<tvm::runtime::GraphRuntime,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<tvm::runtime::GraphRuntime,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  iVar2 = tvm::runtime::GraphRuntime::GetInputIndex(peVar3,name);
  __range1 = (value_type *)0x1;
  peVar3 = std::
           __shared_ptr_access<tvm::runtime::GraphRuntime,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<tvm::runtime::GraphRuntime,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  this_00 = std::
            vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            ::operator[](&(peVar3->attrs_).shape,(long)iVar2);
  __end1 = std::vector<long,_std::allocator<long>_>::begin(this_00);
  sz = (int64_t)std::vector<long,_std::allocator<long>_>::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                                *)&sz);
    if (!bVar1) break;
    plVar4 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
             operator*(&__end1);
    __range1 = (value_type *)(*plVar4 * (long)__range1);
    __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::operator++
              (&__end1);
  }
  return (int64_t)__range1;
}

Assistant:

int64_t DLR::GetShpaeSize(const std::string &name) {
  int in_idx = tvm_graph_runtime_->GetInputIndex(name);
  size_t shape_size = 1;

  for (int64_t sz : tvm_graph_runtime_->attrs_.shape[in_idx])
    shape_size *= static_cast<size_t>(sz);

  return shape_size;
}